

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

bool __thiscall ON_BoundingBox::GetEdges(ON_BoundingBox *this,ON_Line *edges)

{
  byte bVar1;
  uint local_94;
  undefined1 local_90 [4];
  uint i_1;
  uint local_60;
  uint i;
  byte local_49;
  undefined1 local_48 [7];
  bool rc;
  ON_Line line;
  ON_Line *edges_local;
  ON_BoundingBox *this_local;
  
  line.to.z = (double)edges;
  ON_Line::ON_Line((ON_Line *)local_48);
  local_49 = IsValid(this);
  if ((bool)local_49) {
    for (local_60 = 0; local_60 < 0xc; local_60 = local_60 + 1) {
      Edge((ON_Line *)local_90,this,local_60);
      memcpy((void *)((long)line.to.z + (ulong)local_60 * 0x30),local_90,0x30);
      ON_Line::~ON_Line((ON_Line *)local_90);
    }
  }
  else {
    *(double *)line.to.z = ON_3dPoint::UnsetPoint.x;
    *(double *)((long)line.to.z + 8) = ON_3dPoint::UnsetPoint.y;
    *(double *)((long)line.to.z + 0x10) = ON_3dPoint::UnsetPoint.z;
    *(double *)((long)line.to.z + 0x18) = ON_3dPoint::UnsetPoint.x;
    *(double *)((long)line.to.z + 0x20) = ON_3dPoint::UnsetPoint.y;
    *(double *)((long)line.to.z + 0x28) = ON_3dPoint::UnsetPoint.z;
    for (local_94 = 1; local_94 < 0xc; local_94 = local_94 + 1) {
      memcpy((void *)((long)line.to.z + (ulong)local_94 * 0x30),(void *)line.to.z,0x30);
    }
  }
  bVar1 = local_49;
  ON_Line::~ON_Line((ON_Line *)local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool ON_BoundingBox::GetEdges( 
  ON_Line edges[12] 
  ) const
{
  ON_Line line;
  bool rc = IsValid();
  if (rc)
  {
    for (unsigned i = 0U; i < 12; i++ )
    {
      edges[i] = Edge(i);
    }
  }
  else
  {
    edges[0].from = ON_3dPoint::UnsetPoint;
    edges[0].to   = ON_3dPoint::UnsetPoint;
    for (unsigned i = 1U; i < 12; i++ )
      edges[i] = edges[0];
  }

  return rc;
}